

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O3

bool Geometry::OnLine(Point *p,Line *l)

{
  Point *pPVar1;
  byte bVar2;
  double dVar3;
  Point PStack_138;
  Point local_128;
  Point local_118;
  Point local_108;
  Point local_f8;
  Point local_e8;
  Point local_d8;
  Point local_c8;
  Point local_b8;
  Point local_a8;
  Point local_98;
  Point local_88;
  Point local_78;
  Point local_68;
  Point local_58;
  Point local_48;
  Point local_38;
  Point local_28;
  
  local_28.x = (l->a).x;
  local_28.y = (l->a).y;
  local_38.x = p->x;
  local_38.y = p->y;
  operator-((Geometry *)&local_e8,&local_28,&local_38);
  local_48.x = (l->b).x;
  local_48.y = (l->b).y;
  local_58.x = p->x;
  local_58.y = p->y;
  operator-((Geometry *)&local_f8,&local_48,&local_58);
  dVar3 = operator*(&local_e8,&local_f8);
  if (dVar3 < -1e-08 == dVar3 <= 1e-08) {
    bVar2 = 0;
  }
  else {
    local_68.x = p->x;
    local_68.y = p->y;
    local_78.x = (l->a).x;
    local_78.y = (l->a).y;
    operator-((Geometry *)&local_108,&local_68,&local_78);
    pPVar1 = &l->b;
    local_88.x = pPVar1->x;
    local_88.y = (l->b).y;
    local_98.x = (l->a).x;
    local_98.y = (l->a).y;
    operator-((Geometry *)&local_118,&local_88,&local_98);
    dVar3 = operator^(&local_108,&local_118);
    if ((1e-08 < dVar3) || (-1e-08 <= dVar3)) {
      local_a8.x = p->x;
      local_a8.y = p->y;
      local_b8.x = pPVar1->x;
      local_b8.y = (l->b).y;
      operator-((Geometry *)&local_128,&local_a8,&local_b8);
      local_c8.x = (l->a).x;
      local_c8.y = (l->a).y;
      local_d8.x = pPVar1->x;
      local_d8.y = (l->b).y;
      operator-((Geometry *)&PStack_138,&local_c8,&local_d8);
      dVar3 = operator^(&local_128,&PStack_138);
      bVar2 = -(-1e-08 <= dVar3) | -(1e-08 < dVar3);
      Point::~Point(&PStack_138);
      Point::~Point(&local_d8);
      Point::~Point(&local_c8);
      Point::~Point(&local_128);
      Point::~Point(&local_b8);
      Point::~Point(&local_a8);
    }
    else {
      bVar2 = 0;
    }
    Point::~Point(&local_118);
    Point::~Point(&local_98);
    Point::~Point(&local_88);
    Point::~Point(&local_108);
    Point::~Point(&local_78);
    Point::~Point(&local_68);
  }
  Point::~Point(&local_f8);
  Point::~Point(&local_58);
  Point::~Point(&local_48);
  Point::~Point(&local_e8);
  Point::~Point(&local_38);
  Point::~Point(&local_28);
  return (bool)(bVar2 & 1);
}

Assistant:

bool OnLine(Point p, Line l){
		return sgn((l.a - p) * (l.b - p)) == 0 && sgn((p - l.a) ^ (l.b - l.a)) >= 0 && sgn((p - l.b) ^ (l.a - l.b)) >= 0;
	}